

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,Am_Value *in_value)

{
  Am_Value_Type AVar1;
  Am_Wrapper *pAVar2;
  
  if (((short)this->type < 0) && ((this->value).wrapper_value != (Am_Wrapper *)0x0)) {
    Am_Wrapper::Release((this->value).wrapper_value);
  }
  AVar1 = in_value->type;
  this->type = AVar1;
  pAVar2 = (in_value->value).wrapper_value;
  (this->value).wrapper_value = pAVar2;
  if (pAVar2 != (Am_Wrapper *)0x0 && (short)AVar1 < 0) {
    pAVar2->refs = pAVar2->refs + 1;
  }
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(const Am_Value &in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  type = in_value.type;
  value = in_value.value;
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Note_Reference();
  return *this;
}